

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O2

int scale_expansion_zeroelim(int elen,double *e,double b,double *h)

{
  double dVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  dVar1 = splitter;
  dVar5 = splitter * b - (splitter * b - b);
  dVar7 = b - dVar5;
  dVar9 = *e;
  dVar6 = dVar9 * b;
  dVar8 = splitter * dVar9 - (splitter * dVar9 - dVar9);
  dVar9 = (dVar9 - dVar8) * dVar7 -
          (((dVar6 - dVar8 * dVar5) - (dVar9 - dVar8) * dVar5) - dVar8 * dVar7);
  if ((dVar9 != 0.0) || (NAN(dVar9))) {
    *h = dVar9;
    iVar3 = 1;
  }
  else {
    iVar3 = 0;
  }
  lVar4 = 1;
  while( true ) {
    if (elen <= lVar4) break;
    dVar9 = e[lVar4];
    dVar8 = dVar9 * b;
    dVar10 = dVar1 * dVar9 - (dVar1 * dVar9 - dVar9);
    dVar9 = (dVar9 - dVar10) * dVar7 -
            (((dVar8 - dVar10 * dVar5) - (dVar9 - dVar10) * dVar5) - dVar10 * dVar7);
    dVar10 = dVar6 + dVar9;
    dVar9 = (dVar6 - (dVar10 - (dVar10 - dVar6))) + (dVar9 - (dVar10 - dVar6));
    if ((dVar9 != 0.0) || (iVar2 = iVar3, NAN(dVar9))) {
      iVar2 = iVar3 + 1;
      h[iVar3] = dVar9;
    }
    dVar6 = dVar8 + dVar10;
    dVar10 = dVar10 - (dVar6 - dVar8);
    if ((dVar10 != 0.0) || (iVar3 = iVar2, NAN(dVar10))) {
      iVar3 = iVar2 + 1;
      h[iVar2] = dVar10;
    }
    lVar4 = lVar4 + 1;
  }
  if (((dVar6 == 0.0) && (!NAN(dVar6))) && (iVar3 != 0)) {
    return iVar3;
  }
  h[iVar3] = dVar6;
  return iVar3 + 1;
}

Assistant:

int scale_expansion_zeroelim(int elen, REAL *e, REAL b, REAL *h)
/* e and h cannot be the same. */
{
  INEXACT REAL Q, sum;
  REAL hh;
  INEXACT REAL product1;
  REAL product0;
  int eindex, hindex;
  REAL enow;
  INEXACT REAL bvirt;
  REAL avirt, bround, around;
  INEXACT REAL c;
  INEXACT REAL abig;
  REAL ahi, alo, bhi, blo;
  REAL err1, err2, err3;

  Split(b, bhi, blo);
  Two_Product_Presplit(e[0], b, bhi, blo, Q, hh);
  hindex = 0;
  if (hh != 0) {
    h[hindex++] = hh;
  }
  for (eindex = 1; eindex < elen; eindex++) {
    enow = e[eindex];
    Two_Product_Presplit(enow, b, bhi, blo, product1, product0);
    Two_Sum(Q, product0, sum, hh);
    if (hh != 0) {
      h[hindex++] = hh;
    }
    Fast_Two_Sum(product1, sum, Q, hh);
    if (hh != 0) {
      h[hindex++] = hh;
    }
  }
  if ((Q != 0.0) || (hindex == 0)) {
    h[hindex++] = Q;
  }
  return hindex;
}